

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O1

void raviX_buffer_resize(TextBuffer *mb,size_t new_size)

{
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  TextBuffer *mb_00;
  
  if (mb->capacity < new_size) {
    mb_00 = (TextBuffer *)mb->buf;
    sVar3 = new_size;
    pcVar1 = (char *)realloc(mb_00,new_size);
    if (pcVar1 == (char *)0x0) {
      raviX_buffer_resize_cold_1();
      uVar2 = mb_00->pos + sVar3;
      if (mb_00->capacity < uVar2) {
        raviX_buffer_resize(mb_00,uVar2 * 3 + 0x1e >> 1 & 0xfffffffffffffff0);
        if (mb_00->capacity <= sVar3 + mb_00->pos) {
          __assert_fail("mb->capacity > mb->pos + n",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/membuf.c"
                        ,0x47,"void raviX_buffer_reserve(TextBuffer *, size_t)");
        }
      }
      return;
    }
    mb->buf = pcVar1;
    mb->capacity = new_size;
  }
  return;
}

Assistant:

void raviX_buffer_resize(TextBuffer *mb, size_t new_size)
{
	if (new_size <= mb->capacity)
		return;
	char *newmem = (char *)realloc(mb->buf, new_size);
	if (newmem == NULL) {
		fprintf(stderr, "Out of memory\n");
		exit(1);
	}
	mb->buf = newmem;
	mb->capacity = new_size;
}